

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cpp
# Opt level: O2

range_lock * __thiscall pstore::file::range_lock::operator=(range_lock *this,range_lock *other)

{
  size_t sVar1;
  
  if (other != this) {
    unlock(this);
    this->file_ = other->file_;
    sVar1 = other->size_;
    this->offset_ = other->offset_;
    this->size_ = sVar1;
    this->kind_ = other->kind_;
    this->locked_ = other->locked_;
    other->file_ = (file_base *)0x0;
    other->locked_ = false;
  }
  return this;
}

Assistant:

range_lock & range_lock::operator= (range_lock && other) noexcept {
            if (&other != this) {
                no_ex_escape ([this] () { this->unlock (); });
                file_ = other.file_;
                offset_ = other.offset_;
                size_ = other.size_;
                kind_ = other.kind_;
                locked_ = other.locked_;

                other.file_ = nullptr;
                other.locked_ = false;
            }
            return *this;
        }